

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int writeMasterJournal(Pager *pPager,char *zMaster)

{
  sqlite3_io_methods *psVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  i64 jrnlSize;
  undefined8 local_38;
  
  iVar4 = 0;
  if (zMaster != (char *)0x0) {
    iVar4 = 0;
    if (pPager->journalMode != '\x04') {
      psVar1 = pPager->jfd->pMethods;
      if (psVar1 != (sqlite3_io_methods *)0x0) {
        pPager->setMaster = '\x01';
        cVar2 = *zMaster;
        if (cVar2 == '\0') {
          uVar8 = 0;
          uVar6 = 0;
          uVar7 = 0;
        }
        else {
          uVar7 = 0;
          uVar6 = 0;
          do {
            uVar6 = uVar6 + (int)cVar2;
            cVar2 = zMaster[uVar7 + 1];
            uVar7 = uVar7 + 1;
          } while (cVar2 != '\0');
          uVar8 = uVar7 & 0xffffffff;
        }
        if (pPager->fullSync != '\0') {
          if (pPager->journalOff == 0) {
            lVar5 = 0;
          }
          else {
            lVar5 = ((pPager->journalOff + -1) / (long)(ulong)pPager->sectorSize + 1) *
                    (ulong)pPager->sectorSize;
          }
          pPager->journalOff = lVar5;
        }
        lVar5 = pPager->journalOff;
        uVar3 = sqlite3PendingByte / pPager->pageSize + 1;
        local_38._0_4_ =
             uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 * 0x1000000;
        local_38._4_4_ = 0;
        iVar4 = (*psVar1->xWrite)(pPager->jfd,&local_38,4,lVar5);
        if (iVar4 == 0) {
          lVar5 = lVar5 + 4;
          uVar3 = (uint)uVar8;
          iVar4 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,zMaster,uVar3,lVar5);
          if (iVar4 == 0) {
            lVar5 = lVar5 + uVar7;
            local_38._0_4_ =
                 uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
            iVar4 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,&local_38,4,lVar5);
            if (iVar4 == 0) {
              local_38 = CONCAT44(local_38._4_4_,
                                  uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                                  uVar6 << 0x18);
              iVar4 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,&local_38,4,lVar5 + 4);
              if ((iVar4 == 0) &&
                 (iVar4 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,aJournalMagic,8,lVar5 + 8),
                 iVar4 == 0)) {
                pPager->journalOff = uVar8 + pPager->journalOff + 0x14;
                iVar4 = (*pPager->jfd->pMethods->xFileSize)(pPager->jfd,&local_38);
                if (iVar4 == 0) {
                  iVar4 = 0;
                  if (pPager->journalOff < local_38) {
                    iVar4 = (*pPager->jfd->pMethods->xTruncate)(pPager->jfd,pPager->journalOff);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int writeMasterJournal(Pager *pPager, const char *zMaster){
  int rc;                          /* Return code */
  int nMaster;                     /* Length of string zMaster */
  i64 iHdrOff;                     /* Offset of header in journal file */
  i64 jrnlSize;                    /* Size of journal file on disk */
  u32 cksum = 0;                   /* Checksum of string zMaster */

  assert( pPager->setMaster==0 );
  assert( !pagerUseWal(pPager) );

  if( !zMaster 
   || pPager->journalMode==PAGER_JOURNALMODE_MEMORY 
   || !isOpen(pPager->jfd)
  ){
    return SQLITE_OK;
  }
  pPager->setMaster = 1;
  assert( pPager->journalHdr <= pPager->journalOff );

  /* Calculate the length in bytes and the checksum of zMaster */
  for(nMaster=0; zMaster[nMaster]; nMaster++){
    cksum += zMaster[nMaster];
  }

  /* If in full-sync mode, advance to the next disk sector before writing
  ** the master journal name. This is in case the previous page written to
  ** the journal has already been synced.
  */
  if( pPager->fullSync ){
    pPager->journalOff = journalHdrOffset(pPager);
  }
  iHdrOff = pPager->journalOff;

  /* Write the master journal data to the end of the journal file. If
  ** an error occurs, return the error code to the caller.
  */
  if( (0 != (rc = write32bits(pPager->jfd, iHdrOff, PAGER_MJ_PGNO(pPager))))
   || (0 != (rc = sqlite3OsWrite(pPager->jfd, zMaster, nMaster, iHdrOff+4)))
   || (0 != (rc = write32bits(pPager->jfd, iHdrOff+4+nMaster, nMaster)))
   || (0 != (rc = write32bits(pPager->jfd, iHdrOff+4+nMaster+4, cksum)))
   || (0 != (rc = sqlite3OsWrite(pPager->jfd, aJournalMagic, 8,
                                 iHdrOff+4+nMaster+8)))
  ){
    return rc;
  }
  pPager->journalOff += (nMaster+20);

  /* If the pager is in peristent-journal mode, then the physical 
  ** journal-file may extend past the end of the master-journal name
  ** and 8 bytes of magic data just written to the file. This is 
  ** dangerous because the code to rollback a hot-journal file
  ** will not be able to find the master-journal name to determine 
  ** whether or not the journal is hot. 
  **
  ** Easiest thing to do in this scenario is to truncate the journal 
  ** file to the required size.
  */ 
  if( SQLITE_OK==(rc = sqlite3OsFileSize(pPager->jfd, &jrnlSize))
   && jrnlSize>pPager->journalOff
  ){
    rc = sqlite3OsTruncate(pPager->jfd, pPager->journalOff);
  }
  return rc;
}